

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> __thiscall
baryonyx::itm::generate_seed(itm *this,random_engine *rng,uint thread_id)

{
  unsigned_long uVar1;
  unsigned_long __b;
  result_type_conflict rVar2;
  type puVar3;
  uint local_44;
  uint local_40;
  uint j;
  uint i;
  undefined1 local_30 [8];
  uniform_int_distribution<unsigned_long> dst;
  uint thread_id_local;
  random_engine *rng_local;
  __array *ret;
  
  dst._M_param._M_b._3_1_ = 0;
  dst._M_param._M_b._4_4_ = thread_id;
  std::make_unique<unsigned_long[]>((size_t)this);
  uVar1 = std::numeric_limits<unsigned_long>::min();
  __b = std::numeric_limits<unsigned_long>::max();
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)local_30,uVar1,__b);
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)local_30,rng);
  uVar1 = numeric_cast<unsigned_long,unsigned_long>(rVar2);
  puVar3 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                     ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)this,0);
  *puVar3 = uVar1;
  for (local_40 = 1; local_40 != dst._M_param._M_b._4_4_; local_40 = local_40 + 1) {
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)local_30,rng);
    uVar1 = numeric_cast<unsigned_long,unsigned_long>(rVar2);
    puVar3 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                       ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)this,
                        (ulong)local_40);
    *puVar3 = uVar1;
    local_44 = local_40;
    while (local_44 = local_44 - 1, local_44 != 0) {
      puVar3 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                         ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)this
                          ,(ulong)local_44);
      uVar1 = *puVar3;
      puVar3 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                         ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)this
                          ,(ulong)local_40);
      local_44 = local_44;
      if (uVar1 == *puVar3) {
        rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                          ((uniform_int_distribution<unsigned_long> *)local_30,rng);
        uVar1 = numeric_cast<unsigned_long,unsigned_long>(rVar2);
        puVar3 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                           ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                            this,(ulong)local_44);
        *puVar3 = uVar1;
        local_44 = local_40;
      }
    }
  }
  return (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)this;
}

Assistant:

inline std::unique_ptr<random_engine::result_type[]>
generate_seed(random_engine& rng, unsigned thread_id)
{
    using type = random_engine::result_type;

    auto ret = std::make_unique<type[]>(thread_id);

    std::uniform_int_distribution<type> dst(std::numeric_limits<type>::min(),
                                            std::numeric_limits<type>::max());

    ret[0] = numeric_cast<type>(dst(rng));

    for (unsigned i = 1; i != thread_id; ++i) {
        ret[i] = numeric_cast<type>(dst(rng));

        unsigned j = i - 1;
        while (j > 0) {
            if (ret[j] == ret[i]) {
                ret[j] = numeric_cast<type>(dst(rng));
                j = i;
            }

            --j;
        }
    }

    return ret;
}